

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void leaveblock(FuncState *fs)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  LexState *ls;
  BlockCnt *pBVar4;
  BlockCnt *pBVar5;
  Dyndata *pDVar6;
  Vardesc *pVVar7;
  LocVar *pLVar8;
  Dyndata *pDVar9;
  Labeldesc *pLVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  TString *name;
  ulong uVar14;
  int i;
  
  ls = fs->ls;
  pBVar4 = fs->bl;
  if ((pBVar4->previous != (BlockCnt *)0x0) && (pBVar4->upval != '\0')) {
    iVar12 = luaK_jump(fs);
    luaK_patchclose(fs,iVar12,(uint)pBVar4->nactvar);
    luaK_patchtohere(fs,iVar12);
  }
  if (pBVar4->isloop != '\0') {
    name = luaS_new(ls->L,"break");
    iVar12 = newlabelentry(ls,&ls->dyd->label,name,0,ls->fs->pc);
    findgotos(ls,(ls->dyd->label).arr + iVar12);
  }
  pBVar5 = pBVar4->previous;
  fs->bl = pBVar5;
  bVar2 = pBVar4->nactvar;
  bVar3 = fs->nactvar;
  uVar14 = (ulong)bVar3;
  pDVar6 = fs->ls->dyd;
  piVar1 = &(pDVar6->actvar).n;
  *piVar1 = *piVar1 + ((uint)bVar2 - (uint)bVar3);
  if (bVar2 < bVar3) {
    iVar12 = fs->pc;
    pVVar7 = (pDVar6->actvar).arr;
    iVar13 = fs->firstlocal;
    pLVar8 = fs->f->locvars;
    do {
      lVar11 = uVar14 - 1;
      uVar14 = uVar14 - 1;
      pLVar8[pVVar7[iVar13 + lVar11].idx].endpc = iVar12;
    } while (bVar2 < uVar14);
    fs->nactvar = (lu_byte)uVar14;
  }
  fs->freereg = fs->nactvar;
  pDVar9 = ls->dyd;
  (pDVar9->label).n = pBVar4->firstlabel;
  iVar12 = pBVar4->firstgoto;
  if (pBVar5 == (BlockCnt *)0x0) {
    if (iVar12 < (pDVar9->gt).n) {
      undefgoto(ls,(pDVar9->gt).arr + iVar12);
    }
  }
  else {
    for (; iVar12 < (pDVar6->gt).n; iVar12 = iVar12 + (uint)(iVar13 == 0)) {
      pLVar10 = (pDVar6->gt).arr;
      if (pBVar4->nactvar < pLVar10[iVar12].nactvar) {
        if (pBVar4->upval != '\0') {
          luaK_patchclose(fs,pLVar10[iVar12].pc,(uint)pBVar4->nactvar);
        }
        pLVar10[iVar12].nactvar = pBVar4->nactvar;
      }
      iVar13 = findlabel(fs->ls,iVar12);
    }
  }
  return;
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  if (bl->previous && bl->upval) {
    /* create a 'jump to here' to close upvalues */
    int j = luaK_jump(fs);
    luaK_patchclose(fs, j, bl->nactvar);
    luaK_patchtohere(fs, j);
  }
  if (bl->isloop)
    breaklabel(ls);  /* close pending breaks */
  fs->bl = bl->previous;
  removevars(fs, bl->nactvar);
  lua_assert(bl->nactvar == fs->nactvar);
  fs->freereg = fs->nactvar;  /* free registers */
  ls->dyd->label.n = bl->firstlabel;  /* remove local labels */
  if (bl->previous)  /* inner block? */
    movegotosout(fs, bl);  /* update pending gotos to outer block */
  else if (bl->firstgoto < ls->dyd->gt.n)  /* pending gotos in outer block? */
    undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
}